

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zesDeviceResetExt(zes_device_handle_t hDevice,zes_reset_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010ea80 != (code *)0x0) {
    zVar1 = (*DAT_0010ea80)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceResetExt(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle for the device
        zes_reset_properties_t* pProperties             ///< [in] Device reset properties to apply
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnResetExt = context.zesDdiTable.Device.pfnResetExt;
        if( nullptr != pfnResetExt )
        {
            result = pfnResetExt( hDevice, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }